

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_arm.c
# Opt level: O0

void load_arm_feature_mte4(cpu_raw_data_t *raw,cpu_id_t *data,arm_arch_extension_t *ext_status)

{
  byte bVar1;
  _Bool local_24;
  uint8_t mtex;
  uint8_t mte_frac;
  uint8_t mte;
  arm_arch_extension_t *ext_status_local;
  cpu_id_t *data_local;
  cpu_raw_data_t *raw_local;
  
  if (1 < ((byte)(raw->arm_id_aa64pfr[1] >> 8) & 0xf)) {
    bVar1 = (byte)(raw->arm_id_aa64pfr[1] >> 0x34) & 0xf;
    set_feature_status(data,ext_status,(raw->arm_id_aa64pfr[1] & 0xf0000000000) == 0,
                       CPU_FEATURE_MTE_ASYNC,FEATURE_LEVEL_ARM_V8_5_A,FEATURE_LEVEL_UNKNOWN);
    set_feature_status(data,ext_status,bVar1 == 1,CPU_FEATURE_MTE_CANONICAL_TAGS,
                       FEATURE_LEVEL_ARM_V8_7_A,FEATURE_LEVEL_UNKNOWN);
    set_feature_status(data,ext_status,bVar1 == 1,CPU_FEATURE_MTE_NO_ADDRESS_TAGS,
                       FEATURE_LEVEL_ARM_V8_7_A,FEATURE_LEVEL_UNKNOWN);
  }
  local_24 = false;
  if (((data->flags[0x11a] != '\0') && (local_24 = false, data->flags[0x11b] != '\0')) &&
     (local_24 = false, data->flags[0x11e] != '\0')) {
    local_24 = data->flags[0x11d] != '\0';
  }
  set_feature_status(data,ext_status,local_24,CPU_FEATURE_MTE4,FEATURE_LEVEL_ARM_V8_7_A,
                     FEATURE_LEVEL_UNKNOWN);
  return;
}

Assistant:

static void load_arm_feature_mte4(struct cpu_raw_data_t* raw, struct cpu_id_t* data, struct arm_arch_extension_t* ext_status)
{
	/* FEAT_MTE4, Enhanced Memory Tagging Extension */
	const uint8_t mte = EXTRACTS_BITS(raw->arm_id_aa64pfr[1], 11,  8);
	if (mte >= 0b0010) {
		/* These fields are valid only if ID_AA64PFR1_EL1.MTE >= 0b0010 */
		const uint8_t mte_frac = EXTRACTS_BITS(raw->arm_id_aa64pfr[1], 43, 40);
		const uint8_t mtex     = EXTRACTS_BITS(raw->arm_id_aa64pfr[1], 55, 52);
		set_feature_status(data, ext_status, (mte_frac == 0b0000), CPU_FEATURE_MTE_ASYNC,           FEATURE_LEVEL_ARM_V8_5_A, -1);
		set_feature_status(data, ext_status, (mtex == 0b0001),     CPU_FEATURE_MTE_CANONICAL_TAGS,  FEATURE_LEVEL_ARM_V8_7_A, -1);
		set_feature_status(data, ext_status, (mtex == 0b0001),     CPU_FEATURE_MTE_NO_ADDRESS_TAGS, FEATURE_LEVEL_ARM_V8_7_A, -1);
	}
	/* If FEAT_MTE4 is implemented, then FEAT_MTE_CANONICAL_TAGS,
	FEAT_MTE_NO_ADDRESS_TAGS, FEAT_MTE_TAGGED_FAR, and
	FEAT_MTE_STORE_ONLY are implemented. */
	set_feature_status(data, ext_status,
		(data->flags[CPU_FEATURE_MTE_CANONICAL_TAGS] &&
		 data->flags[CPU_FEATURE_MTE_NO_ADDRESS_TAGS] &&
		 data->flags[CPU_FEATURE_MTE_TAGGED_FAR] &&
		 data->flags[CPU_FEATURE_MTE_STORE_ONLY]),
		CPU_FEATURE_MTE4, FEATURE_LEVEL_ARM_V8_7_A, -1);
}